

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3LockAndPrepare
              (sqlite3 *db,char *zSql,int nBytes,u32 prepFlags,Vdbe *pOld,sqlite3_stmt **ppStmt,
              char **pzTail)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  bool local_42;
  int local_40;
  int cnt;
  int rc;
  sqlite3_stmt **ppStmt_local;
  Vdbe *pOld_local;
  u32 prepFlags_local;
  int nBytes_local;
  char *zSql_local;
  sqlite3 *db_local;
  
  local_40 = 0;
  *ppStmt = (sqlite3_stmt *)0x0;
  iVar2 = sqlite3SafetyCheckOk(db);
  if ((iVar2 == 0) || (zSql == (char *)0x0)) {
    db_local._4_4_ = sqlite3MisuseError(0x2174e);
  }
  else {
    sqlite3_mutex_enter(db->mutex);
    sqlite3BtreeEnterAll(db);
    do {
      iVar2 = sqlite3Prepare(db,zSql,nBytes,prepFlags,pOld,ppStmt,pzTail);
      if ((iVar2 == 0) || (db->mallocFailed != '\0')) break;
      if (iVar2 == 0x201) {
        iVar3 = local_40 + 1;
        local_42 = true;
        bVar1 = 0x18 < local_40;
        local_40 = iVar3;
        if (bVar1) goto LAB_001c299c;
      }
      else {
LAB_001c299c:
        iVar3 = local_40;
        if (iVar2 == 0x11) {
          sqlite3ResetOneSchema(db,-1);
          local_40 = local_40 + 1;
        }
        local_42 = iVar2 == 0x11 && iVar3 == 0;
      }
    } while (local_42);
    sqlite3BtreeLeaveAll(db);
    db_local._4_4_ = sqlite3ApiExit(db,iVar2);
    (db->busyHandler).nBusy = 0;
    sqlite3_mutex_leave(db->mutex);
  }
  return db_local._4_4_;
}

Assistant:

static int sqlite3LockAndPrepare(
  sqlite3 *db,              /* Database handle. */
  const char *zSql,         /* UTF-8 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  Vdbe *pOld,               /* VM being reprepared */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const char **pzTail       /* OUT: End of parsed string */
){
  int rc;
  int cnt = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppStmt==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppStmt = 0;
  if( !sqlite3SafetyCheckOk(db)||zSql==0 ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  do{
    /* Make multiple attempts to compile the SQL, until it either succeeds
    ** or encounters a permanent error.  A schema problem after one schema
    ** reset is considered a permanent error. */
    rc = sqlite3Prepare(db, zSql, nBytes, prepFlags, pOld, ppStmt, pzTail);
    assert( rc==SQLITE_OK || *ppStmt==0 );
    if( rc==SQLITE_OK || db->mallocFailed ) break;
  }while( (rc==SQLITE_ERROR_RETRY && (cnt++)<SQLITE_MAX_PREPARE_RETRY)
       || (rc==SQLITE_SCHEMA && (sqlite3ResetOneSchema(db,-1), cnt++)==0) );
  sqlite3BtreeLeaveAll(db);
  rc = sqlite3ApiExit(db, rc);
  assert( (rc&db->errMask)==rc );
  db->busyHandler.nBusy = 0;
  sqlite3_mutex_leave(db->mutex);
  return rc;
}